

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultEvaluator.cpp
# Opt level: O0

void __thiscall ninx::evaluator::DefaultEvaluator::visit(DefaultEvaluator *this,FunctionArgument *e)

{
  anon_class_16_2_d7082910 local_48;
  function<void_()> local_38;
  FunctionArgument *local_18;
  FunctionArgument *e_local;
  DefaultEvaluator *this_local;
  
  local_48.e = &local_18;
  local_48.this = this;
  local_18 = e;
  e_local = (FunctionArgument *)this;
  std::function<void()>::
  function<ninx::evaluator::DefaultEvaluator::visit(ninx::parser::element::FunctionArgument*)::__0,void>
            ((function<void()> *)&local_38,&local_48);
  no_echo(&local_38);
  std::function<void_()>::~function(&local_38);
  return;
}

Assistant:

void ninx::evaluator::DefaultEvaluator::visit(ninx::parser::element::FunctionArgument *e) {
    no_echo([&]{
        // Evaluate the default value if present
        if (e->get_default_value()) {
            e->get_default_value()->accept(this);
        }
    });
}